

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maths.c
# Opt level: O1

void quat_get_axis_angle(quat q,vec3 *axis,float *angle)

{
  float fVar1;
  float fVar2;
  float __x;
  float local_38;
  float fStack_34;
  float local_28;
  
  fVar2 = q.w;
  fVar1 = acosf(fVar2);
  *angle = fVar1 + fVar1;
  __x = 1.0 - fVar2 * fVar2;
  fVar2 = SQRT(__x);
  fVar1 = fVar2;
  if (__x < 0.0) {
    fVar1 = sqrtf(__x);
  }
  local_38 = q.x;
  fStack_34 = q.y;
  axis->x = local_38 / fVar1;
  fVar1 = fVar2;
  if (__x < 0.0) {
    fVar1 = sqrtf(__x);
  }
  axis->y = fStack_34 / fVar1;
  if (__x < 0.0) {
    fVar2 = sqrtf(__x);
  }
  local_28 = q.z;
  axis->z = local_28 / fVar2;
  return;
}

Assistant:

void quat_get_axis_angle(quat q, vec3 *axis, float *angle) {
    *angle = 2.0f * acosf(q.w);
    axis->x = q.x / sqrtf(1.0f - q.w*q.w);
    axis->y = q.y / sqrtf(1.0f - q.w*q.w);
    axis->z = q.z / sqrtf(1.0f - q.w*q.w);
}